

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O0

redisAsyncContext * redisAsyncConnectWithOptions(redisOptions *options)

{
  redisContext *c_00;
  redisAsyncContext *ac;
  redisContext *c;
  redisOptions myOptions;
  redisOptions *options_local;
  
  myOptions.endpoint._16_8_ = options;
  memcpy(&c,options,0x28);
  c._4_4_ = c._4_4_ | 1;
  c_00 = redisConnectWithOptions((redisOptions *)&c);
  if (c_00 == (redisContext *)0x0) {
    options_local = (redisOptions *)0x0;
  }
  else {
    options_local = (redisOptions *)redisAsyncInitialize(c_00);
    if ((redisAsyncContext *)options_local == (redisAsyncContext *)0x0) {
      redisFree(c_00);
      options_local = (redisOptions *)0x0;
    }
    else {
      __redisAsyncCopyError((redisAsyncContext *)options_local);
    }
  }
  return (redisAsyncContext *)options_local;
}

Assistant:

redisAsyncContext *redisAsyncConnectWithOptions(const redisOptions *options) {
    redisOptions myOptions = *options;
    redisContext *c;
    redisAsyncContext *ac;

    myOptions.options |= REDIS_OPT_NONBLOCK;
    c = redisConnectWithOptions(&myOptions);
    if (c == NULL) {
        return NULL;
    }
    ac = redisAsyncInitialize(c);
    if (ac == NULL) {
        redisFree(c);
        return NULL;
    }
    __redisAsyncCopyError(ac);
    return ac;
}